

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_extra.c
# Opt level: O0

char * nsync_time_str(nsync_time t,int decimals)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  int local_2c;
  int i;
  double s;
  int decimals_local;
  nsync_time t_local;
  
  dVar3 = nsync_time_to_dbl(t);
  local_2c = 0;
  while( true ) {
    bVar1 = false;
    if (local_2c != 4) {
      bVar1 = nsync_time_str::scale[local_2c + 1].multiplier <= dVar3;
    }
    if (!bVar1) break;
    local_2c = local_2c + 1;
  }
  pcVar2 = smprintf("%.*f%s",dVar3 / nsync_time_str::scale[local_2c].multiplier,
                    (ulong)(uint)decimals,nsync_time_str::scale[local_2c].suffix);
  return pcVar2;
}

Assistant:

NSYNC_CPP_USING_

char *nsync_time_str (nsync_time t, int decimals) {
	static const struct {
		const char *suffix;
		double multiplier;
	} scale[] = {
		{ "ns", 1.0e-9, },
		{ "us", 1e-6, },
		{ "ms", 1e-3, },
		{ "s", 1.0, },
		{ "hr", 3600.0, },
	};
        double s = nsync_time_to_dbl (t);
	int i = 0;
	while (i + 1 != sizeof (scale) / sizeof (scale[0]) && scale[i + 1].multiplier <= s) {
		i++;
	}
	return (smprintf ("%.*f%s", decimals, s/scale[i].multiplier, scale[i].suffix));
}